

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O2

bool __thiscall SRUP_MSG::Sign(SRUP_MSG *this,char *key)

{
  ushort uVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *__dest;
  bool bVar4;
  SRUP_Crypto Crypto;
  
  iVar2 = (*this->_vptr_SRUP_MSG[9])();
  bVar4 = false;
  if ((key != (char *)0x0) && (bVar4 = false, (char)iVar2 != '\0')) {
    this->m_is_serialized = false;
    SRUP_Crypto::SRUP_Crypto(&Crypto);
    (*this->_vptr_SRUP_MSG[10])(this,1);
    puVar3 = SRUP_Crypto::Sign(&Crypto,this->m_unsigned_message,(ulong)this->m_unsigned_length,key);
    bVar4 = puVar3 != (uint8_t *)0x0;
    if (bVar4) {
      puVar3 = SRUP_Crypto::signature(&Crypto);
      uVar1 = SRUP_Crypto::sigLen(&Crypto);
      this->m_sig_len = uVar1;
      if (this->m_signature != (uint8_t *)0x0) {
        operator_delete__(this->m_signature);
        uVar1 = this->m_sig_len;
      }
      __dest = (uint8_t *)operator_new__((ulong)uVar1);
      this->m_signature = __dest;
      memcpy(__dest,puVar3,(ulong)uVar1);
    }
    SRUP_Crypto::~SRUP_Crypto(&Crypto);
  }
  return bVar4;
}

Assistant:

bool SRUP_MSG::Sign(char *key)
{
    if (!DataCheck())
        return false;

    // Check to see if the key is not null before we try to do anything with it...
    if (key == nullptr)
        return false;

    m_is_serialized = false;

    SRUP_Crypto Crypto;
    unsigned char* p_signature;

    // Running Serialize with preSign = true - will set m_serialized to the byte stream to be signed...
    Serialize(true);
    if (Crypto.Sign(m_unsigned_message, m_unsigned_length, key) == nullptr)
        return false;

    p_signature = Crypto.signature();
    m_sig_len = (uint16_t) Crypto.sigLen();

    delete[] m_signature;
    m_signature = new uint8_t[m_sig_len];

    memcpy(m_signature, p_signature, m_sig_len);

    return true;
}